

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

uint * Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,int Id,uint uSupp)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  Kit_DsdObj_t *pKVar7;
  bool bVar8;
  uint *puVar9;
  uint *puVar10;
  uint uVar11;
  ushort uVar12;
  uint uVar13;
  ulong uVar14;
  Kit_DsdObj_t KVar15;
  ulong uVar16;
  ulong uVar17;
  uint *local_b8 [17];
  
  if (-1 < Id) {
    uVar12 = pNtk->nVars;
    uVar11 = (uint)pNtk->nNodes + (uint)uVar12;
    if ((uint)Id < uVar11) {
      if ((uint)Id < (uint)uVar12) {
        if (p->vTtNodes->nSize <= Id) {
LAB_005d2c65:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        puVar9 = (uint *)p->vTtNodes->pArray[(uint)Id];
        if ((uSupp != 0) && ((uSupp >> (Id & 0x1fU) & 1) == 0)) {
          __assert_fail("!uSupp || uSupp != (uSupp & ~(1<<Id))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x2c2,
                        "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                       );
        }
      }
      else {
        if (p->vTtNodes->nSize <= Id) goto LAB_005d2c65;
        pKVar7 = pNtk->pNodes[(long)Id - (ulong)uVar12];
        if (pKVar7 == (Kit_DsdObj_t *)0x0) {
          __assert_fail("Id < pNtk->nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x2c1,
                        "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                       );
        }
        puVar9 = (uint *)p->vTtNodes->pArray[(uint)Id];
        KVar15 = *pKVar7;
        uVar13 = (uint)KVar15 >> 6 & 7;
        if (uVar13 == 2) {
          if (((uint)KVar15 & 0xfc000000) != 0x4000000) {
            __assert_fail("pObj->nFans == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                          ,0x2d1,
                          "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                         );
          }
          uVar1 = *(ushort *)(pKVar7 + 1);
          uVar13 = (uint)(uVar1 >> 1);
          if (uVar11 <= uVar13) {
            __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                          ,0x9b,"int Kit_DsdLitIsLeaf(Kit_DsdNtk_t *, int)");
          }
          if (uVar12 <= uVar13) {
            __assert_fail("Kit_DsdLitIsLeaf( pNtk, iLit )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                          ,0x2d3,
                          "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                         );
          }
          puVar10 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,uVar13,uSupp);
          uVar2 = pNtk->nVars;
          uVar17 = (ulong)(uint)(1 << ((char)uVar2 - 5U & 0x1f));
          if ((ushort)uVar2 < 6) {
            uVar17 = 1;
          }
          if ((uVar1 & 1) == 0) {
            if (0 < (int)uVar17) {
              uVar17 = uVar17 + 1;
              do {
                puVar9[uVar17 - 2] = puVar10[uVar17 - 2];
                uVar17 = uVar17 - 1;
              } while (1 < uVar17);
            }
          }
          else if (0 < (int)uVar17) {
            uVar17 = uVar17 + 1;
            do {
              puVar9[uVar17 - 2] = ~puVar10[uVar17 - 2];
              uVar17 = uVar17 - 1;
            } while (1 < uVar17);
          }
        }
        else if (uVar13 == 1) {
          if (0x3ffffff < (uint)KVar15) {
            __assert_fail("pObj->nFans == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                          ,0x2c9,
                          "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                         );
          }
          uVar11 = 1 << ((char)uVar12 - 5U & 0x1f);
          if (uVar12 < 6) {
            uVar11 = 1;
          }
          if (0 < (int)uVar11) {
            puVar9 = (uint *)memset(puVar9,0xff,(ulong)uVar11 << 2);
            return puVar9;
          }
        }
        else {
          if (uSupp == 0) {
            if ((uint)KVar15 < 0x4000000) {
              bVar8 = false;
            }
            else {
              uVar17 = 0;
              do {
                bVar8 = false;
                puVar10 = Kit_DsdTruthComputeNodeOne_rec
                                    (p,pNtk,(uint)(*(ushort *)
                                                    ((long)&pKVar7[1].field_0x0 + uVar17 * 2) >> 1),
                                     0);
                local_b8[uVar17] = puVar10;
                uVar17 = uVar17 + 1;
                KVar15 = *pKVar7;
              } while (uVar17 < (uint)KVar15 >> 0x1a);
            }
          }
          else {
            bVar8 = false;
            if (0x3ffffff < (uint)KVar15) {
              uVar17 = 0;
              do {
                uVar1 = *(ushort *)((long)&pKVar7[1].field_0x0 + uVar17 * 2) >> 1;
                uVar11 = (uint)uVar1;
                uVar12 = pNtk->nVars;
                if ((uint)pNtk->nNodes + (uint)uVar12 <= uVar11) {
                  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                                ,0x9c,"unsigned int Kit_DsdLitSupport(Kit_DsdNtk_t *, int)");
                }
                if (pNtk->pSupps == (uint *)0x0) {
                  uVar13 = 0;
                }
                else if (uVar1 < uVar12) {
                  uVar13 = 1 << ((byte)uVar1 & 0x1f);
                }
                else {
                  uVar13 = pNtk->pSupps[(ulong)uVar11 - (ulong)uVar12];
                }
                if ((uVar13 & uSupp) == 0) {
                  bVar8 = true;
                  puVar10 = (uint *)0x0;
                }
                else {
                  puVar10 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,uVar11,uSupp);
                  KVar15 = *pKVar7;
                }
                local_b8[uVar17] = puVar10;
                uVar17 = uVar17 + 1;
              } while (uVar17 < (uint)KVar15 >> 0x1a);
            }
          }
          uVar11 = (uint)KVar15 >> 6 & 7;
          if (uVar11 == 5) {
            if (bVar8) {
              if (0x3ffffff < (uint)KVar15) {
                uVar17 = 0;
                do {
                  if (local_b8[uVar17] != (uint *)0x0) {
                    return local_b8[uVar17];
                  }
                  uVar17 = uVar17 + 1;
                } while ((uint)KVar15 >> 0x1a != uVar17);
              }
              __assert_fail("i < pObj->nFans",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                            ,0x310,
                            "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                           );
            }
            if ((uint)KVar15 < 0x4000000) {
              uVar11 = (uint)KVar15 >> 0x1a;
            }
            else {
              uVar17 = 0;
              do {
                if ((*(byte *)((long)&pKVar7[1].field_0x0 + uVar17 * 2) & 1) != 0) {
                  uVar5 = pNtk->nVars;
                  uVar11 = 1 << ((char)uVar5 - 5U & 0x1f);
                  if ((ushort)uVar5 < 6) {
                    uVar11 = 1;
                  }
                  if (0 < (int)uVar11) {
                    puVar10 = local_b8[uVar17];
                    uVar16 = (ulong)uVar11 + 1;
                    do {
                      puVar10[uVar16 - 2] = ~puVar10[uVar16 - 2];
                      uVar16 = uVar16 - 1;
                    } while (1 < uVar16);
                    KVar15 = *pKVar7;
                  }
                }
                uVar17 = uVar17 + 1;
                uVar11 = (uint)KVar15 >> 0x1a;
              } while (uVar17 < uVar11);
            }
            puVar10 = (uint *)0x0;
            if (((uint)KVar15 & 0x1c0) == 0x140) {
              puVar10 = (uint *)((long)&pKVar7[1].field_0x0 + (ulong)((uint)KVar15 >> 8 & 0x3fc));
            }
            puVar10 = Kit_TruthCompose(p->dd,puVar10,uVar11,local_b8,(uint)pNtk->nVars,p->vTtBdds,
                                       p->vNodes);
            uVar6 = pNtk->nVars;
            uVar11 = 1 << ((char)uVar6 - 5U & 0x1f);
            if ((ushort)uVar6 < 6) {
              uVar11 = 1;
            }
            if (0 < (int)uVar11) {
              uVar17 = (ulong)uVar11 + 1;
              do {
                puVar9[uVar17 - 2] = puVar10[uVar17 - 2];
                uVar17 = uVar17 - 1;
              } while (1 < uVar17);
            }
          }
          else if (uVar11 == 4) {
            uVar4 = pNtk->nVars;
            uVar11 = 1 << ((char)uVar4 - 5U & 0x1f);
            if ((ushort)uVar4 < 6) {
              uVar11 = 1;
            }
            uVar17 = (ulong)uVar11;
            if (0 < (int)uVar11) {
              memset(puVar9,0,uVar17 * 4);
              KVar15 = *pKVar7;
            }
            if (0x3ffffff < (uint)KVar15) {
              uVar16 = 0;
              uVar12 = 0;
              do {
                puVar10 = local_b8[uVar16];
                if (puVar10 != (uint *)0x0) {
                  uVar1 = *(ushort *)((long)&pKVar7[1].field_0x0 + uVar16 * 2);
                  uVar14 = uVar17 + 1;
                  if (0 < (int)uVar11) {
                    do {
                      puVar9[uVar14 - 2] = puVar9[uVar14 - 2] ^ puVar10[uVar14 - 2];
                      uVar14 = uVar14 - 1;
                    } while (1 < uVar14);
                    KVar15 = *pKVar7;
                  }
                  uVar12 = uVar12 ^ uVar1 & 1;
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 < (uint)KVar15 >> 0x1a);
              if ((0 < (int)uVar11) && (uVar12 != 0)) {
                uVar17 = uVar17 + 1;
                do {
                  puVar9[uVar17 - 2] = ~puVar9[uVar17 - 2];
                  uVar17 = uVar17 - 1;
                } while (1 < uVar17);
              }
            }
          }
          else {
            if (uVar11 != 3) {
              __assert_fail("pObj->Type == KIT_DSD_PRIME",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                            ,0x308,
                            "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                           );
            }
            uVar3 = pNtk->nVars;
            uVar11 = 1 << ((char)uVar3 - 5U & 0x1f);
            if ((ushort)uVar3 < 6) {
              uVar11 = 1;
            }
            if (0 < (int)uVar11) {
              memset(puVar9,0xff,(ulong)uVar11 * 4);
              KVar15 = *pKVar7;
            }
            if (0x3ffffff < (uint)KVar15) {
              uVar16 = (ulong)uVar11 + 1;
              uVar17 = 0;
              do {
                puVar10 = local_b8[uVar17];
                if (puVar10 != (uint *)0x0) {
                  if ((*(byte *)((long)&pKVar7[1].field_0x0 + uVar17 * 2) & 1) == 0) {
                    uVar14 = uVar16;
                    if (0 < (int)uVar11) {
                      do {
                        puVar9[uVar14 - 2] = puVar9[uVar14 - 2] & puVar10[uVar14 - 2];
                        uVar14 = uVar14 - 1;
                      } while (1 < uVar14);
                    }
                  }
                  else {
                    uVar14 = uVar16;
                    if (0 < (int)uVar11) {
                      do {
                        puVar9[uVar14 - 2] = puVar9[uVar14 - 2] & ~puVar10[uVar14 - 2];
                        uVar14 = uVar14 - 1;
                      } while (1 < uVar14);
                    }
                  }
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 < (uint)*pKVar7 >> 0x1a);
            }
          }
        }
      }
      return puVar9;
    }
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

unsigned * Kit_DsdTruthComputeNodeOne_rec( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, int Id, unsigned uSupp )
{
    Kit_DsdObj_t * pObj;
    unsigned * pTruthRes, * pTruthFans[16], * pTruthTemp;
    unsigned i, iLit, fCompl, nPartial = 0;
//    unsigned m, nMints, * pTruthPrime, * pTruthMint; 

    // get the node with this ID
    pObj = Kit_DsdNtkObj( pNtk, Id );
    pTruthRes = (unsigned *)Vec_PtrEntry( p->vTtNodes, Id );

    // special case: literal of an internal node
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        assert( !uSupp || uSupp != (uSupp & ~(1<<Id)) );
        return pTruthRes;
    }

    // constant node
    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        assert( pObj->nFans == 0 );
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        return pTruthRes;
    }

    // elementary variable node
    if ( pObj->Type == KIT_DSD_VAR )
    {
        assert( pObj->nFans == 1 );
        iLit = pObj->pFans[0];
        assert( Kit_DsdLitIsLeaf( pNtk, iLit ) );
        pTruthFans[0] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp );
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthRes, pTruthFans[0], pNtk->nVars );
        else
            Kit_TruthCopy( pTruthRes, pTruthFans[0], pNtk->nVars );
        return pTruthRes;
    }

    // collect the truth tables of the fanins
    if ( uSupp )
    {
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( uSupp != (uSupp & ~Kit_DsdLitSupport(pNtk, iLit)) )
                pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp );
            else
            {
                pTruthFans[i] = NULL;
                nPartial = 1;
            }
    }
    else
    {
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp );
    }
    // create the truth table

    // simple gates
    if ( pObj->Type == KIT_DSD_AND )
    {
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( pTruthFans[i] )
                Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
        return pTruthRes;
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        Kit_TruthClear( pTruthRes, pNtk->nVars );
        fCompl = 0;
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            if ( pTruthFans[i] )
            {
                Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
                fCompl ^= Abc_LitIsCompl(iLit);
            }
        }
        if ( fCompl )
            Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
        return pTruthRes;
    }
    assert( pObj->Type == KIT_DSD_PRIME );

    if ( uSupp && nPartial )
    {
        // find the only non-empty component
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( pTruthFans[i] )
                break;
        assert( i < pObj->nFans );
        return pTruthFans[i];
    }
/*
    // get the truth table of the prime node
    pTruthPrime = Kit_DsdObjTruth( pObj );
    // get storage for the temporary minterm
    pTruthMint = Vec_PtrEntry(p->vTtNodes, pNtk->nVars + pNtk->nNodes);
    // go through the minterms
    nMints = (1 << pObj->nFans);
    Kit_TruthClear( pTruthRes, pNtk->nVars );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !Kit_TruthHasBit(pTruthPrime, m) )
            continue;
        Kit_TruthFill( pTruthMint, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthMint, pTruthMint, pTruthFans[i], pNtk->nVars, 0, ((m & (1<<i)) == 0) ^ Abc_LitIsCompl(iLit) );
        Kit_TruthOr( pTruthRes, pTruthRes, pTruthMint, pNtk->nVars );
    }
*/
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthFans[i], pTruthFans[i], pNtk->nVars );
    pTruthTemp = Kit_TruthCompose( p->dd, Kit_DsdObjTruth(pObj), pObj->nFans, pTruthFans, pNtk->nVars, p->vTtBdds, p->vNodes );
    Kit_TruthCopy( pTruthRes, pTruthTemp, pNtk->nVars );
    return pTruthRes;
}